

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dumpmode.c
# Opt level: O0

int DumpModeEncode(TIFF *tif,uint8_t *pp,tmsize_t cc,uint16_t s)

{
  int iVar1;
  long local_38;
  tmsize_t n;
  tmsize_t tStack_28;
  uint16_t s_local;
  tmsize_t cc_local;
  uint8_t *pp_local;
  TIFF *tif_local;
  
  tStack_28 = cc;
  cc_local = (tmsize_t)pp;
  while( true ) {
    if (tStack_28 < 1) {
      return 1;
    }
    local_38 = tStack_28;
    if (tif->tif_rawdatasize < tif->tif_rawcc + tStack_28) {
      local_38 = tif->tif_rawdatasize - tif->tif_rawcc;
    }
    if (local_38 < 1) break;
    if (tif->tif_rawcp != (uint8_t *)cc_local) {
      _TIFFmemcpy(tif->tif_rawcp,(void *)cc_local,local_38);
    }
    tif->tif_rawcp = tif->tif_rawcp + local_38;
    tif->tif_rawcc = local_38 + tif->tif_rawcc;
    cc_local = local_38 + cc_local;
    tStack_28 = tStack_28 - local_38;
    if ((tif->tif_rawdatasize <= tif->tif_rawcc) && (iVar1 = TIFFFlushData1(tif), iVar1 == 0)) {
      return 0;
    }
  }
  __assert_fail("n > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dumpmode.c"
                ,0x34,"int DumpModeEncode(TIFF *, uint8_t *, tmsize_t, uint16_t)");
}

Assistant:

static int DumpModeEncode(TIFF *tif, uint8_t *pp, tmsize_t cc, uint16_t s)
{
    (void)s;
    while (cc > 0)
    {
        tmsize_t n;

        n = cc;
        if (tif->tif_rawcc + n > tif->tif_rawdatasize)
            n = tif->tif_rawdatasize - tif->tif_rawcc;

        assert(n > 0);

        /*
         * Avoid copy if client has setup raw
         * data buffer to avoid extra copy.
         */
        if (tif->tif_rawcp != pp)
            _TIFFmemcpy(tif->tif_rawcp, pp, n);
        tif->tif_rawcp += n;
        tif->tif_rawcc += n;
        pp += n;
        cc -= n;
        if (tif->tif_rawcc >= tif->tif_rawdatasize && !TIFFFlushData1(tif))
            return (0);
    }
    return (1);
}